

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O0

bool __thiscall pg::SPMSolver::pm_less(SPMSolver *this,int *a,int *b,int d,int pl)

{
  int local_48;
  int local_38;
  int i;
  int start;
  int pl_local;
  int d_local;
  int *b_local;
  int *a_local;
  SPMSolver *this_local;
  
  if (a[pl] == -1) {
    this_local._7_1_ = false;
  }
  else if (b[pl] == -1) {
    this_local._7_1_ = true;
  }
  else {
    if ((this->k & 1U) == (long)pl) {
      local_48 = (int)this->k + -2;
    }
    else {
      local_48 = (int)this->k + -1;
    }
    for (local_38 = local_48; d <= local_38; local_38 = local_38 + -2) {
      if (a[local_38] != b[local_38]) {
        if ((this->counts[local_38] < a[local_38]) && (this->counts[local_38] < b[local_38])) {
          return false;
        }
        return a[local_38] < b[local_38];
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
SPMSolver::pm_less(int* a, int* b, int d, int pl)
{
    // cases where a or b is Top
    if (a[pl] == -1) return false;
    if (b[pl] == -1) return true;
    // normal comparison, start with highest priority
    const int start = ((k&1) == pl) ? k-2 : k-1;
    for (int i=start; i>=d; i-=2) {
        if (a[i] == b[i]) continue;
        if (a[i] > counts[i] and b[i] > counts[i]) return false;
        return a[i] < b[i];
    }
    return false;
}